

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.h
# Opt level: O0

GOESRProduct * __thiscall GOESRProduct::operator=(GOESRProduct *this,GOESRProduct *param_2)

{
  Product *in_RSI;
  GOESRProduct *in_RDI;
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  *unaff_retaddr;
  
  std::
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
  operator=(unaff_retaddr,&in_RDI->files_);
  (in_RDI->frameStart_).tv_sec = *(__time_t *)((long)&(in_RSI->nameShort).field_2 + 8);
  (in_RDI->frameStart_).tv_nsec = *(__syscall_slong_t *)&in_RSI->nameLong;
  Product::operator=(in_RSI,(Product *)in_RDI);
  Region::operator=((Region *)in_RSI,(Region *)in_RDI);
  Channel::operator=((Channel *)in_RSI,(Channel *)in_RDI);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->satellite_,
             (string *)&((Channel *)in_RSI)[3].nameLong._M_string_length);
  in_RDI->satelliteID_ = (int)((Channel *)in_RSI)[4].nameShort._M_string_length;
  std::__cxx11::string::operator=
            ((string *)&in_RDI->instrument_,
             (string *)((Channel *)in_RSI)[4].nameShort.field_2._M_local_buf);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->imagingMode_,
             (string *)((Channel *)in_RSI)[4].nameLong.field_2._M_local_buf);
  std::__cxx11::string::operator=
            ((string *)&in_RDI->resolution_,
             (string *)((Channel *)in_RSI)[5].nameShort.field_2._M_local_buf);
  in_RDI->segmented_ = (bool)(((Channel *)in_RSI)[5].nameLong.field_2._M_local_buf[0] & 1);
  return in_RDI;
}

Assistant:

GOESRProduct() = default;